

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptProxy::StrictEquals
          (JavascriptProxy *this,Var other,BOOL *value,ScriptContext *requestContext)

{
  ImplicitCallFlags *pIVar1;
  bool bVar2;
  
  *value = 0;
  bVar2 = IsRevoked(this);
  if (!bVar2) {
    bVar2 = (requestContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
            DisableImplicitNoFlag;
    if (bVar2) {
      pIVar1 = &requestContext->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_External;
    }
    else {
      *value = (uint)((JavascriptProxy *)other == this);
    }
    return (uint)!bVar2;
  }
  JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"strict equal");
}

Assistant:

BOOL JavascriptProxy::StrictEquals(__in Var other, __out BOOL* value, ScriptContext* requestContext)
    {
        *value = FALSE;
        //RecyclableObject* targetObj;
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("strict equal"));
        }
        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }
        *value = (other == this);
        return true;
    }